

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
BitSet::toArray(vector<int,_std::allocator<int>_> *__return_storage_ptr__,BitSet *this)

{
  const_reference cVar1;
  undefined8 in_RAX;
  uint i;
  uint uVar2;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_28 = in_RAX;
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8; uVar2 = uVar2 + 1)
  {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->storage,(ulong)uVar2);
    if (cVar1) {
      uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)((long)&uStack_28 + 4));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> BitSet::toArray() const
{
	std::vector<int> elems;
	for (unsigned int i=0;i<storage.size();i++) {
		if (storage[i])
			elems.push_back(i);
	}

	return elems;
}